

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::NegativeSSBO::Run(NegativeSSBO *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  char *format;
  long lVar3;
  GLint status;
  GLint status_comp;
  char *glsl_fs1;
  char *glsl_vs;
  string local_48;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_ARB_shader_storage_buffer_object");
  if (bVar1) {
    glsl_vs = 
    "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
    ;
    glsl_fs1 = 
    "#version 420 core\n#extension GL_ARB_shader_storage_buffer_object: require\nlayout(location = 0) out uvec4 o_color[4];\nlayout(binding = 0) buffer Buffer {\n  layout(binding = 0, offset = 16) uniform atomic_uint ac_counter0;\n};\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));\n}"
    ;
    this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
    GVar2 = glu::CallLogWrapper::glCreateProgram(this_00);
    this->prog_ = GVar2;
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,this->prog_,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&glsl_vs,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
    glu::CallLogWrapper::glGetShaderiv(this_00,GVar2,0x8b81,&status_comp);
    if (status_comp == 1) {
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
      glu::CallLogWrapper::glAttachShader(this_00,this->prog_,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&glsl_fs1,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(this_00,GVar2);
      glu::CallLogWrapper::glGetShaderiv(this_00,GVar2,0x8b81,&status_comp);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
      glu::CallLogWrapper::glGetProgramiv(this_00,this->prog_,0x8b82,&status);
      if (status_comp != 1) {
        return 0;
      }
      if (status != 1) {
        return 0;
      }
      format = "Expected error during fragment shader compilation or linking.";
    }
    else {
      format = "Unexpected error during vertex shader compilation.";
    }
    gl4cts::anon_unknown_0::Output(format);
    lVar3 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GL_ARB_shader_storage_buffer_object not supported",
               (allocator<char> *)&glsl_vs);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{

		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_storage_buffer_object"))
		{
			OutputNotSupported("GL_ARB_shader_storage_buffer_object not supported");
			return NO_ERROR;
		}

		// create program
		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							  "  gl_Position = i_vertex;" NL "}";

		const char* glsl_fs1 = "#version 420 core" NL "#extension GL_ARB_shader_storage_buffer_object: require" NL
							   "layout(location = 0) out uvec4 o_color[4];" NL "layout(binding = 0) buffer Buffer {" NL
							   "  layout(binding = 0, offset = 16) uniform atomic_uint ac_counter0;" NL "};" NL
							   "void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));" NL "}";

		prog_ = glCreateProgram();

		GLuint sh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(prog_, sh);
		glShaderSource(sh, 1, &glsl_vs, NULL);
		glCompileShader(sh);
		GLint status_comp;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status_comp);
		if (status_comp != GL_TRUE)
		{
			Output("Unexpected error during vertex shader compilation.");
			return ERROR;
		}
		glDeleteShader(sh);

		sh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(prog_, sh);
		glShaderSource(sh, 1, &glsl_fs1, NULL);
		glCompileShader(sh);
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status_comp);
		glDeleteShader(sh);

		GLint status;
		glLinkProgram(prog_);
		glGetProgramiv(prog_, GL_LINK_STATUS, &status);
		if (status_comp == GL_TRUE && status == GL_TRUE)
		{
			Output("Expected error during fragment shader compilation or linking.");
			return ERROR;
		}
		return NO_ERROR;
	}